

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

maybe<color,_void> * __thiscall
pstore::command_line::parser<color,_void>::operator()
          (maybe<color,_void> *__return_storage_ptr__,parser<color,_void> *this,string *v)

{
  type tVar1;
  pointer plVar2;
  __type _Var3;
  pointer plVar4;
  long lVar5;
  long lVar6;
  pointer __rhs;
  
  __rhs = (this->super_parser_base).literals_.
          super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
          ._M_impl.super__Vector_impl_data._M_start;
  plVar2 = (this->super_parser_base).literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)plVar2 - (long)__rhs;
  for (lVar6 = lVar5 / 0x48 >> 2; plVar4 = __rhs, 0 < lVar6; lVar6 = lVar6 + -1) {
    _Var3 = std::operator==(v,&__rhs->name);
    if (_Var3) goto LAB_00118e88;
    _Var3 = std::operator==(v,&__rhs[1].name);
    plVar4 = __rhs + 1;
    if (_Var3) goto LAB_00118e88;
    _Var3 = std::operator==(v,&__rhs[2].name);
    plVar4 = __rhs + 2;
    if (_Var3) goto LAB_00118e88;
    _Var3 = std::operator==(v,&__rhs[3].name);
    plVar4 = __rhs + 3;
    if (_Var3) goto LAB_00118e88;
    __rhs = __rhs + 4;
    lVar5 = lVar5 + -0x120;
  }
  lVar5 = lVar5 / 0x48;
  if (lVar5 == 1) {
LAB_00118eb2:
    _Var3 = std::operator==(v,&__rhs->name);
    plVar4 = __rhs;
    if (!_Var3) {
      plVar4 = plVar2;
    }
  }
  else if (lVar5 == 2) {
LAB_00118e72:
    _Var3 = std::operator==(v,&plVar4->name);
    if (!_Var3) {
      __rhs = plVar4 + 1;
      goto LAB_00118eb2;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_00118e98;
    _Var3 = std::operator==(v,&__rhs->name);
    if (!_Var3) {
      plVar4 = __rhs + 1;
      goto LAB_00118e72;
    }
  }
LAB_00118e88:
  if (plVar4 != plVar2) {
    tVar1 = (type)plVar4->value;
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = tVar1;
    return __return_storage_ptr__;
  }
LAB_00118e98:
  __return_storage_ptr__->valid_ = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  __return_storage_ptr__->storage_ = (type)0x0;
  return __return_storage_ptr__;
}

Assistant:

maybe<T> operator() (std::string const & v) const {
                auto begin = this->begin ();
                auto end = this->end ();
                auto it =
                    std::find_if (begin, end, [&v] (literal const & lit) { return v == lit.name; });
                if (it == end) {
                    return nothing<T> ();
                }
                return just (T (it->value));
            }